

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::incoming_request_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,incoming_request_alert *this)

{
  uint uVar1;
  undefined8 uVar2;
  allocator<char> local_445 [13];
  string local_438;
  char local_418 [8];
  char msg [1024];
  incoming_request_alert *this_local;
  
  msg._1016_8_ = this;
  peer_alert::message_abi_cxx11_(&local_438,&this->super_peer_alert);
  uVar2 = std::__cxx11::string::c_str();
  uVar1 = libtorrent::aux::strong_typedef::operator_cast_to_int
                    ((strong_typedef *)&(this->super_peer_alert).field_0x9c);
  snprintf(local_418,0x400,"%s: incoming request [ piece: %d start: %d length: %d ]",uVar2,
           (ulong)uVar1,(ulong)*(uint *)&this->field_0xa0,*(undefined4 *)&this->field_0xa4);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_418,local_445);
  std::allocator<char>::~allocator(local_445);
  return __return_storage_ptr__;
}

Assistant:

std::string incoming_request_alert::message() const
	{
		char msg[1024];
		std::snprintf(msg, sizeof(msg), "%s: incoming request [ piece: %d start: %d length: %d ]"
			, peer_alert::message().c_str(), static_cast<int>(req.piece)
			, req.start, req.length);
		return msg;
	}